

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Expression> __thiscall Parser::lambda(Parser *this)

{
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Expression> pVar1;
  shared_ptr<Function> local_b8;
  allocator<char> local_a1;
  Identifier local_a0;
  undefined1 local_80 [8];
  ptr<ObjectExpression> objectDescriptor;
  undefined1 local_60 [24];
  ptr<Function> function;
  undefined1 local_30 [8];
  IdentifierList parameters;
  Parser *this_local;
  
  consume(in_RSI);
  consume(in_RSI,LeftParen,"\'(\'");
  identifierList_abi_cxx11_((IdentifierList *)local_30,in_RSI);
  consume(in_RSI,RightParen,"\')\'");
  make<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60);
  statementBlock((Parser *)
                 &objectDescriptor.super___shared_ptr<ObjectExpression,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  make<Function,std::shared_ptr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::shared_ptr<StatementBlock>>
            ((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_60 + 0x10),(shared_ptr<StatementBlock> *)local_60);
  std::shared_ptr<StatementBlock>::~shared_ptr
            ((shared_ptr<StatementBlock> *)
             &objectDescriptor.super___shared_ptr<ObjectExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~shared_ptr((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_60);
  make<ObjectExpression>();
  this_00 = std::__shared_ptr_access<ObjectExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<ObjectExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"call",&local_a1);
  std::shared_ptr<Function>::shared_ptr(&local_b8,(shared_ptr<Function> *)(local_60 + 0x10));
  ObjectExpression::putFunction(this_00,&local_a0,Public,&local_b8);
  std::shared_ptr<Function>::~shared_ptr(&local_b8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::shared_ptr<Expression>::shared_ptr<ObjectExpression,void>
            ((shared_ptr<Expression> *)this,(shared_ptr<ObjectExpression> *)local_80);
  std::shared_ptr<ObjectExpression>::~shared_ptr((shared_ptr<ObjectExpression> *)local_80);
  std::shared_ptr<Function>::~shared_ptr((shared_ptr<Function> *)(local_60 + 0x10));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::lambda() {
    consume();
    consume(TokenType::LeftParen, "'('");
    IdentifierList parameters = identifierList();
    consume(TokenType::RightParen, "')'");

    ptr<Function> function = make<Function>(make<IdentifierList>(parameters), statementBlock());

    ptr<ObjectExpression> objectDescriptor = make<ObjectExpression>();
    objectDescriptor -> putFunction("call", Scope::Public, function);
    return objectDescriptor;
}